

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.h
# Opt level: O3

bool __thiscall slang::ast::Type::isNumeric(Type *this)

{
  bool bVar1;
  Type *pTVar2;
  bool bVar3;
  
  bVar1 = isIntegral(this);
  bVar3 = true;
  if (!bVar1) {
    pTVar2 = this->canonical;
    if (pTVar2 == (Type *)0x0) {
      resolveCanonical(this);
      pTVar2 = this->canonical;
    }
    bVar3 = (pTVar2->super_Symbol).kind == FloatingType;
  }
  return bVar3;
}

Assistant:

bool isNumeric() const { return isIntegral() || isFloating(); }